

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O2

vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> * __thiscall
cfd::AddressFactory::GetAddressesFromMultisig
          (vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__return_storage_ptr__,
          AddressFactory *this,AddressType address_type,Script *redeem_script,
          vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *pubkey_list)

{
  CfdException *this_00;
  pointer pubkey;
  AddressType address_type_local;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *local_378;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  Script script;
  Address addr;
  Address local_1a8;
  
  address_type_local = address_type;
  if ((kP2shP2wpkhAddress < address_type) || ((0x54U >> (address_type & 0x1f) & 1) == 0)) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/cfd_address.cpp"
                 + 0x51;
    addr.witness_ver_ = 0x130;
    addr.address_._M_dataplus._M_p = "GetAddressesFromMultisig";
    core::logger::warn<cfd::core::AddressType&>
              ((CfdSourceLocation *)&addr,
               "Failed to GetAddressesFromMultisig. Invalid address_type passed:  addressType={}",
               &address_type_local);
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,
               "Invalid address_type. address_type must be \"p2pkh\" \"p2wpkh\" or \"p2sh-p2wpkh\"."
               ,(allocator *)&local_1a8);
    core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  core::ScriptUtil::ExtractPubkeysFromMultisigScript(&pubkeys,redeem_script,(uint32_t *)0x0);
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::Address,_std::allocator<cfd::core::Address>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::Address::Address(&addr);
  local_378 = pubkey_list;
  core::Script::Script(&script);
  pubkey = pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl
           .super__Vector_impl_data._M_start;
  do {
    if (pubkey == pubkeys.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (local_378 != (vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)0x0) {
        std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::operator=
                  (local_378,&pubkeys);
      }
      core::Script::~Script(&script);
      core::Address::~Address(&addr);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&pubkeys);
      return __return_storage_ptr__;
    }
    if (address_type == kP2shP2wpkhAddress) {
      core::ScriptUtil::CreateP2wpkhLockingScript((Script *)&local_1a8,pubkey);
      core::Script::operator=(&script,(Script *)&local_1a8);
      core::Script::~Script((Script *)&local_1a8);
      CreateP2shAddress(&local_1a8,this,&script);
      core::Address::operator=(&addr,&local_1a8);
LAB_0032f368:
      core::Address::~Address(&local_1a8);
    }
    else {
      if (address_type == kP2wpkhAddress) {
        CreateP2wpkhAddress(&local_1a8,this,pubkey);
        core::Address::operator=(&addr,&local_1a8);
        goto LAB_0032f368;
      }
      if (address_type == kP2pkhAddress) {
        CreateP2pkhAddress(&local_1a8,this,pubkey);
        core::Address::operator=(&addr,&local_1a8);
        goto LAB_0032f368;
      }
    }
    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::push_back
              (__return_storage_ptr__,&addr);
    pubkey = pubkey + 1;
  } while( true );
}

Assistant:

std::vector<Address> AddressFactory::GetAddressesFromMultisig(
    AddressType address_type, const Script& redeem_script,
    std::vector<Pubkey>* pubkey_list) const {
  if ((address_type != AddressType::kP2pkhAddress) &&
      (address_type != AddressType::kP2wpkhAddress) &&
      (address_type != AddressType::kP2shP2wpkhAddress)) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to GetAddressesFromMultisig. Invalid address_type passed:  "
        "addressType={}",  // NOLINT
        address_type);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid address_type. address_type must be \"p2pkh\" "
        "\"p2wpkh\" or \"p2sh-p2wpkh\".");  // NOLINT
  }

  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<Address> addr_list;
  Address addr;
  Script script;
  for (const auto& pubkey : pubkeys) {
    if (address_type == AddressType::kP2pkhAddress) {
      addr = CreateP2pkhAddress(pubkey);
    } else if (address_type == AddressType::kP2shP2wpkhAddress) {
      script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
      addr = CreateP2shAddress(script);
    } else if (address_type == AddressType::kP2wpkhAddress) {
      // Currently we support only witness version 0.
      addr = CreateP2wpkhAddress(pubkey);
    }
    addr_list.push_back(addr);
  }

  if (pubkey_list) *pubkey_list = pubkeys;
  return addr_list;
}